

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitHandler.cxx
# Opt level: O3

void __thiscall
cmCTestSubmitHandler::SelectParts
          (cmCTestSubmitHandler *this,
          set<cmCTest::Part,_std::less<cmCTest::Part>,_std::allocator<cmCTest::Part>_> *parts)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr *pp_Var3;
  long lVar4;
  _Base_ptr p_Var5;
  _Rb_tree_header *p_Var6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  
  p_Var2 = (parts->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var6 = &(parts->_M_t)._M_impl.super__Rb_tree_header;
  lVar4 = 0;
  do {
    p_Var5 = &p_Var6->_M_header;
    p_Var8 = &p_Var6->_M_header;
    p_Var7 = p_Var2;
    if (p_Var2 != (_Base_ptr)0x0) {
      do {
        p_Var1 = p_Var7 + 1;
        if (lVar4 <= (int)p_Var1->_M_color) {
          p_Var5 = p_Var7;
        }
        pp_Var3 = &p_Var7->_M_left;
        p_Var7 = pp_Var3[(int)p_Var1->_M_color < lVar4];
      } while (pp_Var3[(int)p_Var1->_M_color < lVar4] != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var5 != p_Var6) &&
         (p_Var8 = p_Var5, lVar4 < (int)p_Var5[1]._M_color)) {
        p_Var8 = &p_Var6->_M_header;
      }
    }
    this->SubmitPart[lVar4] = (_Rb_tree_header *)p_Var8 != p_Var6;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0xc);
  return;
}

Assistant:

void cmCTestSubmitHandler::SelectParts(std::set<cmCTest::Part> const& parts)
{
  // Check whether each part is selected.
  for (cmCTest::Part p = cmCTest::PartStart; p != cmCTest::PartCount;
       p = static_cast<cmCTest::Part>(p + 1)) {
    this->SubmitPart[p] = parts.find(p) != parts.end();
  }
}